

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

void __thiscall basist::selector::init_flags(selector *this)

{
  long in_RDI;
  uint32_t i;
  uint32_t s;
  uint32_t x;
  uint32_t y;
  uint32_t hist [4];
  uint32_t in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  uint uVar1;
  uint uVar2;
  int local_18 [6];
  
  memset(local_18,0,0x10);
  for (uVar2 = 0; uVar2 < 4; uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 < 4; uVar1 = uVar1 + 1) {
      in_stack_ffffffffffffffdc =
           get_selector((selector *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffdc,
                        in_stack_ffffffffffffffd8);
      local_18[in_stack_ffffffffffffffdc] = local_18[in_stack_ffffffffffffffdc] + 1;
    }
  }
  *(undefined1 *)(in_RDI + 8) = 3;
  *(undefined1 *)(in_RDI + 9) = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  for (uVar2 = 0; uVar2 < 4; uVar2 = uVar2 + 1) {
    if (local_18[uVar2] != 0) {
      *(char *)(in_RDI + 10) = *(char *)(in_RDI + 10) + '\x01';
      if (uVar2 < *(byte *)(in_RDI + 8)) {
        *(char *)(in_RDI + 8) = (char)uVar2;
      }
      if (*(byte *)(in_RDI + 9) < uVar2) {
        *(char *)(in_RDI + 9) = (char)uVar2;
      }
    }
  }
  return;
}

Assistant:

void init_flags()
		{
			uint32_t hist[4] = { 0, 0, 0, 0 };
			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					uint32_t s = get_selector(x, y);
					hist[s]++;
				}
			}

			m_lo_selector = 3;
			m_hi_selector = 0;
			m_num_unique_selectors = 0;

			for (uint32_t i = 0; i < 4; i++)
			{
				if (hist[i])
				{
					m_num_unique_selectors++;
					if (i < m_lo_selector) m_lo_selector = static_cast<uint8_t>(i);
					if (i > m_hi_selector) m_hi_selector = static_cast<uint8_t>(i);
				}
			}
		}